

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char sqlite3ExprAffinity(Expr *pExpr)

{
  u8 uVar1;
  char cVar2;
  Expr *pEVar3;
  ExprList *pEVar4;
  
  do {
    pEVar3 = sqlite3ExprSkipCollate(pExpr);
    if ((pEVar3->flags & 0x200) != 0) {
      return '\0';
    }
    uVar1 = pEVar3->op;
    if (uVar1 == 0xa8) {
      uVar1 = pEVar3->op2;
LAB_00166173:
      if (uVar1 != 0xaa) {
        if ((uVar1 == 0xa4) || (uVar1 == 0xa2)) {
          if ((pEVar3->y).pTab != (Table *)0x0) {
            if (-1 < (long)pEVar3->iColumn) {
              return ((pEVar3->y).pTab)->aCol[pEVar3->iColumn].affinity;
            }
            return 'D';
          }
        }
        else if (uVar1 == '$') {
          cVar2 = sqlite3AffinityType((pEVar3->u).zToken,(Column *)0x0);
          return cVar2;
        }
        return pEVar3->affinity;
      }
      pEVar4 = (ExprList *)
               &((pEVar3->pLeft->x).pSelect)->pEList->a[(long)pEVar3->iColumn + -1].sortOrder;
    }
    else {
      if (uVar1 != 0x83) goto LAB_00166173;
      pEVar4 = ((pEVar3->x).pSelect)->pEList;
    }
    pExpr = pEVar4->a[0].pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE char sqlite3ExprAffinity(Expr *pExpr){
  int op;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( pExpr->flags & EP_Generic ) return 0;
  op = pExpr->op;
  if( op==TK_SELECT ){
    assert( pExpr->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(pExpr->x.pSelect->pEList->a[0].pExpr);
  }
  if( op==TK_REGISTER ) op = pExpr->op2;
#ifndef SQLITE_OMIT_CAST
  if( op==TK_CAST ){
    assert( !ExprHasProperty(pExpr, EP_IntValue) );
    return sqlite3AffinityType(pExpr->u.zToken, 0);
  }
#endif
  if( (op==TK_AGG_COLUMN || op==TK_COLUMN) && pExpr->y.pTab ){
    return sqlite3TableColumnAffinity(pExpr->y.pTab, pExpr->iColumn);
  }
  if( op==TK_SELECT_COLUMN ){
    assert( pExpr->pLeft->flags&EP_xIsSelect );
    return sqlite3ExprAffinity(
        pExpr->pLeft->x.pSelect->pEList->a[pExpr->iColumn].pExpr
    );
  }
  return pExpr->affinity;
}